

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnElemSegmentFunctionIndex
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  Var *this_00;
  pointer ppEVar1;
  ElemSegment *pEVar2;
  pointer pVVar3;
  char *__s;
  Offset OVar4;
  size_t sVar5;
  undefined1 auStack_98 [8];
  Location loc;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U == (ulong)segment_index) {
    pEVar2 = ppEVar1[segment_index];
    std::vector<wabt::Var,_std::allocator<wabt::Var>_>::emplace_back<>(&pEVar2->vars);
    pVVar3 = *(pointer *)
              ((long)&(pEVar2->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                      _M_impl + 8);
    loc.filename.size_._0_4_ = 0;
    loc.filename.size_._4_4_ = 0;
    loc.field_1.field_0.line = 0;
    auStack_98 = (undefined1  [8])0x0;
    loc.filename.data_._0_4_ = 0;
    loc.filename.data_._4_4_ = 0;
    __s = this->filename_;
    sVar5 = strlen(__s);
    loc.filename.data_._0_4_ = (undefined4)sVar5;
    loc.filename.data_._4_4_ = (undefined4)(sVar5 >> 0x20);
    OVar4 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    loc.filename.size_._0_4_ = (undefined4)OVar4;
    loc.filename.size_._4_4_ = (undefined4)(OVar4 >> 0x20);
    this_00 = (Var *)((long)&loc.field_1 + 8);
    auStack_98 = (undefined1  [8])__s;
    Var::Var(this_00,func_index,(Location *)auStack_98);
    Var::operator=(pVVar3 + -1,this_00);
    Var::~Var((Var *)((long)&loc.field_1 + 8));
    return (Result)Ok;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x3e5,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentFunctionIndex(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentFunctionIndex(Index segment_index,
                                                  Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  segment->vars.emplace_back();
  Var* var = &segment->vars.back();
  *var = Var(func_index, GetLocation());
  return Result::Ok;
}